

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::Base64EscapeInternal
              (uchar *src,int szsrc,char *dest,int szdest,char *base64,bool do_padding)

{
  uint uVar1;
  uint uVar2;
  LogMessage *pLVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  uint *puVar8;
  char *pcVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (szsrc < 1) {
    return 0;
  }
  iVar7 = szsrc * 4;
  if (iVar7 != szdest * 3 && SBORROW4(iVar7,szdest * 3) == iVar7 + szdest * -3 < 0) {
    return 0;
  }
  puVar8 = (uint *)src;
  pcVar9 = dest;
  if (src < src + ((ulong)(uint)szsrc - 3)) {
    do {
      uVar5 = *puVar8;
      uVar2 = (uVar5 & 0xff0000) >> 8;
      uVar1 = uVar2 | (uVar5 & 0xff00) << 8;
      *pcVar9 = base64[(uVar5 << 0x18) >> 0x1a];
      pcVar9[1] = base64[(uVar1 | uVar5 << 0x18) >> 0x14 & 0x3f];
      pcVar9[2] = base64[(uVar1 & 0xfc000) >> 0xe];
      pcVar9[3] = base64[(uVar2 & 0x3f00) >> 8];
      pcVar9 = pcVar9 + 4;
      puVar8 = (uint *)((long)puVar8 + 3);
    } while (puVar8 < src + ((ulong)(uint)szsrc - 3));
  }
  uVar5 = (uint)(src + ((ulong)(uint)szsrc - (long)puVar8));
  if (uVar5 < 4) {
    uVar5 = (szdest + (int)dest) - (int)pcVar9;
    switch((ulong)(src + ((ulong)(uint)szsrc - (long)puVar8)) & 0xffffffff) {
    case 0:
      goto switchD_002c5a20_caseD_0;
    case 1:
      if ((int)uVar5 < 2) {
        return 0;
      }
      uVar1 = *puVar8;
      *pcVar9 = base64[(byte)((byte)uVar1 >> 2)];
      pcVar9[1] = base64[((byte)uVar1 & 3) << 4];
      if (!do_padding) {
        pcVar9 = pcVar9 + 2;
        goto switchD_002c5a20_caseD_0;
      }
      if (uVar5 < 4) {
        return 0;
      }
      pcVar9[2] = '=';
      pcVar9[3] = '=';
      break;
    case 2:
      if ((int)uVar5 < 3) {
        return 0;
      }
      uVar4 = (ushort)*puVar8 << 8;
      uVar6 = uVar4 | (ushort)*puVar8 >> 8;
      *pcVar9 = base64[uVar4 >> 10];
      pcVar9[1] = base64[uVar6 >> 4 & 0x3f];
      pcVar9[2] = base64[(ulong)(uVar6 & 0xf) * 4];
      if (!do_padding) {
        pcVar9 = pcVar9 + 3;
        goto switchD_002c5a20_caseD_0;
      }
      if (uVar5 == 3) {
        return 0;
      }
      pcVar9[3] = '=';
      break;
    case 3:
      if ((int)uVar5 < 4) {
        return 0;
      }
      uVar5 = *puVar8;
      uVar4 = *(ushort *)((long)puVar8 + 1) << 8 | *(ushort *)((long)puVar8 + 1) >> 8;
      *pcVar9 = base64[(byte)((byte)uVar5 >> 2)];
      pcVar9[1] = base64[(((byte)uVar5 & 3) << 0x10 | (uint)uVar4) >> 0xc];
      pcVar9[2] = base64[uVar4 >> 6 & 0x3f];
      pcVar9[3] = base64[uVar4 & 0x3f];
    }
    pcVar9 = pcVar9 + 4;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x88b);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"Logic problem? szsrc = ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,uVar5);
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
switchD_002c5a20_caseD_0:
  return (int)pcVar9 - (int)dest;
}

Assistant:

int Base64EscapeInternal(const unsigned char *src, int szsrc,
                         char *dest, int szdest, const char *base64,
                         bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc <= 0) return 0;

  if (szsrc * 4 > szdest * 3) return 0;

  char *cur_dest = dest;
  const unsigned char *cur_src = src;

  char *limit_dest = dest + szdest;
  const unsigned char *limit_src = src + szsrc;

  // Three bytes of data encodes to four characters of cyphertext.
  // So we can pump through three-byte chunks atomically.
  while (cur_src < limit_src - 3) {  // keep going as long as we have >= 32 bits
    uint32 in = BigEndian::Load32(cur_src) >> 8;

    cur_dest[0] = base64[in >> 18];
    in &= 0x3FFFF;
    cur_dest[1] = base64[in >> 12];
    in &= 0xFFF;
    cur_dest[2] = base64[in >> 6];
    in &= 0x3F;
    cur_dest[3] = base64[in];

    cur_dest += 4;
    cur_src += 3;
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = limit_dest - cur_dest;
  szsrc = limit_src - cur_src;

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cypherblock.
      if ((szdest -= 2) < 0) return 0;
      uint32 in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      if (do_padding) {
        if ((szdest -= 2) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cypherblock.
      if ((szdest -= 3) < 0) return 0;
      uint32 in = BigEndian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      if (do_padding) {
        if ((szdest -= 1) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if ((szdest -= 4) < 0) return 0;
      uint32 in = (cur_src[0] << 16) + BigEndian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      GOOGLE_LOG(FATAL) << "Logic problem? szsrc = " << szsrc;
      break;
  }
  return (cur_dest - dest);
}